

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varmap.cc
# Opt level: O0

void __thiscall
MapState::addRange(MapState *this,uintb st,Datatype *ct,uint4 fl,RangeType rt,int4 hi)

{
  Datatype *val;
  bool bVar1;
  int4 iVar2;
  uint4 uVar3;
  RangeHint *pRVar4;
  RangeHint *local_50;
  RangeHint *range;
  intb sst;
  int4 local_30;
  int4 local_2c;
  int4 sz;
  int4 hi_local;
  RangeType rt_local;
  uint4 fl_local;
  Datatype *ct_local;
  uintb st_local;
  MapState *this_local;
  
  local_2c = hi;
  sz = rt;
  hi_local = fl;
  ct_local = (Datatype *)st;
  st_local = (uintb)this;
  if ((ct == (Datatype *)0x0) || (_rt_local = ct, iVar2 = Datatype::getSize(ct), iVar2 == 0)) {
    _rt_local = this->defaultType;
  }
  local_30 = Datatype::getSize(_rt_local);
  Address::Address((Address *)&sst,this->spaceid,(uintb)ct_local);
  bVar1 = RangeList::inRange(&this->range,(Address *)&sst,local_30);
  val = ct_local;
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    uVar3 = AddrSpace::getWordSize(this->spaceid);
    range = (RangeHint *)AddrSpace::byteToAddress((uintb)val,uVar3);
    uVar3 = AddrSpace::getAddrSize(this->spaceid);
    sign_extend((intb *)&range,uVar3 * 8 + -1);
    pRVar4 = range;
    uVar3 = AddrSpace::getWordSize(this->spaceid);
    range = (RangeHint *)AddrSpace::addressToByte((uintb)pRVar4,uVar3);
    pRVar4 = (RangeHint *)operator_new(0x30);
    RangeHint::RangeHint(pRVar4,(uintb)ct_local,local_30,(intb)range,_rt_local,hi_local,sz,local_2c)
    ;
    local_50 = pRVar4;
    std::vector<RangeHint_*,_std::allocator<RangeHint_*>_>::push_back(&this->maplist,&local_50);
  }
  return;
}

Assistant:

void MapState::addRange(uintb st,Datatype *ct,uint4 fl,RangeHint::RangeType rt,int4 hi)

{
  if ((ct == (Datatype *)0)||(ct->getSize()==0)) // Must have a real type
    ct = defaultType;
  int4 sz = ct->getSize();
  if (!range.inRange(Address(spaceid,st),sz))
    return;
  intb sst = (intb)AddrSpace::byteToAddress(st,spaceid->getWordSize());
  sign_extend(sst,spaceid->getAddrSize()*8-1);
  sst = (intb)AddrSpace::addressToByte(sst,spaceid->getWordSize());
  RangeHint *range = new RangeHint(st,sz,sst,ct,fl,rt,hi);
  maplist.push_back(range);
#ifdef OPACTION_DEBUG
  if (debugon) {
    ostringstream s;
    s << "Add Range: " << hex << st << ":" << dec << sz;
    s << " ";
    ct->printRaw(s);
    s << endl;
    glb->printDebug(s.str());
  }
#endif
}